

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::StandardPropertyCaseItemSyntax::getChildPtr
          (StandardPropertyCaseItemSyntax *this,size_t index)

{
  undefined8 in_RSI;
  long in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  PtrTokenOrSyntax *in_stack_ffffffffffffffc0;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    PtrTokenOrSyntax::PtrTokenOrSyntax
              ((PtrTokenOrSyntax *)(in_RDI + 0x18),in_stack_ffffffffffffffb8);
    break;
  case 1:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
    break;
  case 2:
    not_null<slang::syntax::PropertyExprSyntax_*>::get
              ((not_null<slang::syntax::PropertyExprSyntax_*> *)(in_RDI + 0x60));
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case 3:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax StandardPropertyCaseItemSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &expressions;
        case 1: return &colon;
        case 2: return expr.get();
        case 3: return &semi;
        default: return nullptr;
    }
}